

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraphFlattener::convertFlattenedInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node)

{
  Ref<embree::SceneGraph::Node> *pRVar1;
  long *plVar2;
  long *plVar3;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  
  if (node->ptr == (Node *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::TransformNode::typeinfo,0);
  }
  if (plVar2 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                      &SceneGraph::GroupNode::typeinfo,0);
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      pRVar1 = (Ref<embree::SceneGraph::Node> *)plVar3[0xe];
      for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar3[0xd]; node_00 != pRVar1;
          node_00 = node_00 + 1) {
        convertFlattenedInstances(this,group,node_00);
      }
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x18))(plVar3);
    }
  }
  else {
    (**(code **)(*plVar2 + 0x10))(plVar2);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::push_back(group,node);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))(plVar2);
  }
  return;
}

Assistant:

void convertFlattenedInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node)
    {
      if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        group.push_back(node);
      } 
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertFlattenedInstances(group,child);
      }
    }